

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool __thiscall S2Loop::MayIntersect(S2Loop *this,S2Cell *target)

{
  bool bVar1;
  bool bVar2;
  CellRelation CVar3;
  const_iterator cVar4;
  Iterator it;
  Iterator local_80;
  S2Point local_40;
  
  local_80.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
  local_80.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_80.super_IteratorBase._vptr_IteratorBase = (_func_int **)&PTR__IteratorBase_002bb190;
  local_80.iter_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  local_80.iter_.position = -1;
  local_80.end_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  local_80.end_.position = -1;
  if ((this->index_).index_status_._M_i != FRESH) {
    MutableS2ShapeIndex::ApplyUpdatesThreadSafe(&this->index_);
  }
  local_80.index_ = &this->index_;
  cVar4 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 *)&(this->index_).cell_map_);
  local_80.iter_.node = cVar4.node;
  local_80.iter_.position = cVar4.position;
  local_80.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
  local_80.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_80.end_.node = local_80.iter_.node;
  local_80.end_.position = local_80.iter_.position;
  CVar3 = MutableS2ShapeIndex::Iterator::Locate(&local_80,(S2CellId)(target->id_).id_);
  if (CVar3 == DISJOINT) {
    bVar2 = false;
  }
  else if (CVar3 == SUBDIVIDED) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    if ((local_80.super_IteratorBase.id_.id_ != (target->id_).id_) &&
       (bVar1 = BoundaryApproxIntersects(this,&local_80,target), !bVar1)) {
      S2Cell::GetCenter(&local_40,target);
      bVar2 = Contains(this,&local_80,&local_40);
    }
  }
  return bVar2;
}

Assistant:

bool S2Loop::MayIntersect(const S2Cell& target) const {
  MutableS2ShapeIndex::Iterator it(&index_);
  S2ShapeIndex::CellRelation relation = it.Locate(target.id());

  // If "target" does not overlap any index cell, there is no intersection.
  if (relation == S2ShapeIndex::DISJOINT) return false;

  // If "target" is subdivided into one or more index cells, there is an
  // intersection to within the S2ShapeIndex error bound (see Contains).
  if (relation == S2ShapeIndex::SUBDIVIDED) return true;

  // If "target" is an index cell, there is an intersection because index cells
  // are created only if they have at least one edge or they are entirely
  // contained by the loop.
  if (it.id() == target.id()) return true;

  // Otherwise check if any edges intersect "target".
  if (BoundaryApproxIntersects(it, target)) return true;

  // Otherwise check if the loop contains the center of "target".
  return Contains(it, target.GetCenter());
}